

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnitTest.cpp
# Opt level: O0

bool DoesCodecProduceOriginals
               (WirehairCodec decoder,uint N,uint blockBytes,uint finalBytes,uint8_t *message,
               uint8_t *decodedMessage,uint messageBytes)

{
  WirehairResult WVar1;
  int iVar2;
  ostream *poVar3;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  WirehairCodec in_R8;
  void *in_R9;
  uint expectedBytes;
  WirehairResult blockResult;
  uint32_t recoveredBytes;
  uint i;
  WirehairResult recoverResult;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffbc;
  WirehairResult in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffcc;
  bool local_1;
  
  *(undefined1 *)((long)in_R9 + (ulong)blockResult) = 0xee;
  WVar1 = wirehair_recover((WirehairCodec)
                           CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (WVar1 == Wirehair_Success) {
    iVar2 = memcmp(in_R8,in_R9,(ulong)blockResult);
    if (iVar2 == 0) {
      if (*(char *)((long)in_R9 + (ulong)blockResult) == -0x12) {
        for (uVar5 = 0; uVar5 < in_ESI; uVar5 = uVar5 + 1) {
          *(undefined1 *)((long)in_R9 + (ulong)in_ECX) = 0xee;
          in_stack_ffffffffffffffc0 =
               wirehair_recover_block
                         (in_R8,(uint)((ulong)in_R9 >> 0x20),(void *)CONCAT44(WVar1,uVar5),
                          (uint32_t *)(ulong)in_stack_ffffffffffffffc0);
          if (in_stack_ffffffffffffffc0 != Wirehair_Success) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "Failed to wirehair_recover_block with original pieces for N = "
                                    );
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
            poVar3 = std::operator<<(poVar3,", i = ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar5);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            return false;
          }
          if ((uVar5 == in_ESI - 1) && (*(char *)((long)in_R9 + (ulong)in_ECX) != -0x12)) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "Failed to wirehair_recover_block memory corruption with original pieces for N = "
                                    );
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            return false;
          }
          uVar4 = in_EDX;
          if (uVar5 == in_ESI - 1) {
            uVar4 = in_ECX;
          }
          iVar2 = memcmp(in_R8 + uVar5 * in_EDX,in_R9,(ulong)uVar4);
          if (iVar2 != 0) {
            poVar3 = std::operator<<((ostream *)&std::cout,
                                     "Failed to wirehair_recover_block the data with original pieces for N = "
                                    );
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            return false;
          }
        }
        local_1 = true;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Failed to recover buffer overrun with original pieces for N = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_1 = false;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Failed to recover the data with original pieces for N = ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Failed to recover with original pieces for N = "
                            );
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_ESI);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool DoesCodecProduceOriginals(
    WirehairCodec decoder,
    unsigned N,
    unsigned blockBytes,
    unsigned finalBytes,
    const uint8_t* message,
    uint8_t* decodedMessage,
    unsigned messageBytes)
{
    // Check buffer overflow
    decodedMessage[messageBytes] = kPadChar;

    WirehairResult recoverResult = wirehair_recover(decoder, decodedMessage, messageBytes);

    if (recoverResult != Wirehair_Success)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover with original pieces for N = " << N << endl;
        return false;
    }

    if (0 != memcmp(message, decodedMessage, messageBytes))
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover the data with original pieces for N = " << N << endl;
        return false;
    }

    if (decodedMessage[messageBytes] != kPadChar)
    {
        SIAMESE_DEBUG_BREAK();
        cout << "Failed to recover buffer overrun with original pieces for N = " << N << endl;
        return false;
    }

    for (unsigned i = 0; i < N; ++i)
    {
        decodedMessage[finalBytes] = kPadChar;

        uint32_t recoveredBytes = 0;
        WirehairResult blockResult = wirehair_recover_block(decoder, i, decodedMessage, &recoveredBytes);

        if (blockResult != Wirehair_Success)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block with original pieces for N = " << N << ", i = " << i << endl;
            return false;
        }

        if ((i == N - 1) && decodedMessage[finalBytes] != kPadChar)
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block memory corruption with original pieces for N = " << N << endl;
            return false;
        }

        const unsigned expectedBytes = (i == N - 1) ? finalBytes : blockBytes;

        if (0 != memcmp(message + i * blockBytes, decodedMessage, expectedBytes))
        {
            SIAMESE_DEBUG_BREAK();
            cout << "Failed to wirehair_recover_block the data with original pieces for N = " << N << endl;
            return false;
        }
    }

    return true;
}